

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter2.cpp
# Opt level: O0

chapter2 * __thiscall chapter2::max(chapter2 *this,string *t1,string *t2)

{
  bool bVar1;
  string *local_38;
  string *t2_local;
  string *t1_local;
  
  bVar1 = std::operator>(t1,t2);
  local_38 = (string *)t1;
  if (!bVar1) {
    local_38 = (string *)t2;
  }
  std::__cxx11::string::string((string *)this,local_38);
  return this;
}

Assistant:

string max(string &t1, string &t2) {
        return t1 > t2 ? t1 : t2;
    }